

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_mtc0_store32(TCGContext_conflict6 *tcg_ctx,TCGv_i64 arg,target_ulong off)

{
  TCGTemp *ts;
  
  ts = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I32,false);
  tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),arg);
  tcg_gen_op3_mips64el
            (tcg_ctx,INDEX_op_st_i32,(TCGArg)ts,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),off);
  tcg_temp_free_internal_mips64el(tcg_ctx,ts);
  return;
}

Assistant:

static inline void gen_mtc0_store32(TCGContext *tcg_ctx, TCGv arg, target_ulong off)
{
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_trunc_tl_i32(tcg_ctx, t0, arg);
    tcg_gen_st_i32(tcg_ctx, t0, tcg_ctx->cpu_env, off);
    tcg_temp_free_i32(tcg_ctx, t0);
}